

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O0

void __thiscall MetaDCEGraph::dump(MetaDCEGraph *this)

{
  char *pcVar1;
  bool bVar2;
  reference pNVar3;
  reference __in;
  type *ptVar4;
  type *__k;
  ostream *poVar5;
  mapped_type *pmVar6;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *this_00;
  reference pNVar7;
  ostream *poVar8;
  ostream *in_RCX;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name target;
  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_130;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  _Self local_108;
  _Self local_100;
  ostream *local_f8;
  char *pcStack_f0;
  type *local_e8;
  type *node;
  type *name;
  _Node_iterator_base<std::pair<const_wasm::Name,_DCENode>,_true> local_d0;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
  *__range1_2;
  type *dceName;
  type *id;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_90;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *__range1_1;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  importMap;
  Name root;
  iterator __end1;
  iterator __begin1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range1;
  MetaDCEGraph *this_local;
  
  std::operator<<((ostream *)&std::cout,"=== graph ===\n");
  __end1 = std::
           unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
           ::begin(&this->roots);
  root.super_IString.str._M_str =
       (char *)std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::end(&this->roots);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<wasm::Name,_true>,
                            (_Node_iterator_base<wasm::Name,_true> *)&root.super_IString.str._M_str)
        , bVar2) {
    pNVar3 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end1);
    poVar5 = (ostream *)(pNVar3->super_IString).str._M_len;
    root.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    in_RCX = poVar5;
    poVar8 = std::operator<<((ostream *)&std::cout,"root: ");
    name_00.super_IString.str._M_str = (char *)in_RCX;
    name_00.super_IString.str._M_len = root.super_IString.str._M_len;
    importMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)poVar5;
    poVar5 = wasm::operator<<((wasm *)poVar8,poVar5,name_00);
    std::operator<<(poVar5,'\n');
    std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end1);
  }
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         *)&__range1_1);
  __end1_1 = std::
             unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::begin(&this->importIdToDCENode);
  local_90._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::end(&this->importIdToDCENode);
  while (bVar2 = std::__detail::operator!=
                           (&__end1_1.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>
                            ,&local_90), bVar2) {
    __in = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>::
           operator*(&__end1_1);
    ptVar4 = std::get<0ul,wasm::Name_const,wasm::Name>(__in);
    __k = std::get<1ul,wasm::Name_const,wasm::Name>(__in);
    pmVar6 = std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                           *)&__range1_1,__k);
    wasm::Name::operator=(pmVar6,ptVar4);
    std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>::operator++
              (&__end1_1);
  }
  __end1_2 = std::
             unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
             ::begin(&this->nodes);
  local_d0._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
       ::end(&this->nodes);
  while (bVar2 = std::__detail::operator!=
                           (&__end1_2.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_DCENode>,_true>,
                            &local_d0), bVar2) {
    name = &std::__detail::_Node_iterator<std::pair<const_wasm::Name,_DCENode>,_false,_true>::
            operator*(&__end1_2)->first;
    node = (type *)std::get<0ul,wasm::Name_const,DCENode>((pair<const_wasm::Name,_DCENode> *)name);
    local_e8 = std::get<1ul,wasm::Name_const,DCENode>((pair<const_wasm::Name,_DCENode> *)name);
    poVar5 = std::operator<<((ostream *)&std::cout,"node: ");
    local_f8 = (ostream *)(node->name).super_IString.str._M_len;
    pcStack_f0 = (node->name).super_IString.str._M_str;
    name_01.super_IString.str._M_str = (char *)in_RCX;
    name_01.super_IString.str._M_len = (size_t)pcStack_f0;
    poVar5 = wasm::operator<<((wasm *)poVar5,local_f8,name_01);
    std::operator<<(poVar5,'\n');
    local_100._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         ::find((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 *)&__range1_1,&node->name);
    local_108._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         ::end((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                *)&__range1_1);
    bVar2 = std::operator!=(&local_100,&local_108);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"  is import ");
      pmVar6 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)&__range1_1,&node->name);
      name_02.super_IString.str._M_str = (char *)in_RCX;
      name_02.super_IString.str._M_len = (size_t)(pmVar6->super_IString).str._M_str;
      poVar5 = wasm::operator<<((wasm *)poVar5,(ostream *)(pmVar6->super_IString).str._M_len,name_02
                               );
      std::operator<<(poVar5,'\n');
    }
    this_00 = &local_e8->reaches;
    __end2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(this_00);
    local_130._M_current =
         (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&local_130), bVar2) {
      pNVar7 = __gnu_cxx::
               __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
               ::operator*(&__end2);
      poVar5 = (ostream *)(pNVar7->super_IString).str._M_len;
      pcVar1 = (pNVar7->super_IString).str._M_str;
      poVar8 = std::operator<<((ostream *)&std::cout,"  reaches: ");
      name_03.super_IString.str._M_str = (char *)in_RCX;
      name_03.super_IString.str._M_len = (size_t)pcVar1;
      poVar5 = wasm::operator<<((wasm *)poVar8,poVar5,name_03);
      std::operator<<(poVar5,'\n');
      __gnu_cxx::
      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
      operator++(&__end2);
    }
    std::__detail::_Node_iterator<std::pair<const_wasm::Name,_DCENode>,_false,_true>::operator++
              (&__end1_2);
  }
  std::operator<<((ostream *)&std::cout,"=============\n");
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          *)&__range1_1);
  return;
}

Assistant:

void dump() {
    std::cout << "=== graph ===\n";
    for (auto root : roots) {
      std::cout << "root: " << root << '\n';
    }
    std::map<Name, ImportId> importMap;
    for (auto& [id, dceName] : importIdToDCENode) {
      importMap[dceName] = id;
    }
    for (auto& [name, node] : nodes) {
      std::cout << "node: " << name << '\n';
      if (importMap.find(name) != importMap.end()) {
        std::cout << "  is import " << importMap[name] << '\n';
      }
      for (auto target : node.reaches) {
        std::cout << "  reaches: " << target << '\n';
      }
    }
    std::cout << "=============\n";
  }